

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EnumTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::EnumTypeSyntax,slang::syntax::EnumTypeSyntax_const&>
          (BumpAllocator *this,EnumTypeSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  EnumTypeSyntax *pEVar13;
  
  pEVar13 = (EnumTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EnumTypeSyntax *)this->endPtr < pEVar13 + 1) {
    pEVar13 = (EnumTypeSyntax *)allocateSlow(this,0xc0,8);
  }
  else {
    this->head->current = (byte *)(pEVar13 + 1);
  }
  (pEVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)
           &(args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  (pEVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
       = uVar4;
  (pEVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  (pEVar13->openBrace).info = (args->openBrace).info;
  TVar9 = (args->keyword).kind;
  uVar10 = (args->keyword).field_0x2;
  NVar11.raw = (args->keyword).numFlags.raw;
  uVar12 = (args->keyword).rawLen;
  pIVar2 = (args->keyword).info;
  TVar5 = (args->openBrace).kind;
  uVar6 = (args->openBrace).field_0x2;
  NVar7.raw = (args->openBrace).numFlags.raw;
  uVar8 = (args->openBrace).rawLen;
  pEVar13->baseType = args->baseType;
  (pEVar13->openBrace).kind = TVar5;
  (pEVar13->openBrace).field_0x2 = uVar6;
  (pEVar13->openBrace).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar13->openBrace).rawLen = uVar8;
  (pEVar13->keyword).kind = TVar9;
  (pEVar13->keyword).field_0x2 = uVar10;
  (pEVar13->keyword).numFlags = (NumericTokenFlags)NVar11.raw;
  (pEVar13->keyword).rawLen = uVar12;
  (pEVar13->keyword).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar13->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar13->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pEVar13->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar13->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pEVar13->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  (pEVar13->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005db698;
  sVar3 = (args->members).elements._M_extent._M_extent_value;
  (pEVar13->members).elements._M_ptr = (args->members).elements._M_ptr;
  (pEVar13->members).elements._M_extent._M_extent_value = sVar3;
  uVar6 = (args->closeBrace).field_0x2;
  NVar7.raw = (args->closeBrace).numFlags.raw;
  uVar8 = (args->closeBrace).rawLen;
  pIVar2 = (args->closeBrace).info;
  (pEVar13->closeBrace).kind = (args->closeBrace).kind;
  (pEVar13->closeBrace).field_0x2 = uVar6;
  (pEVar13->closeBrace).numFlags = (NumericTokenFlags)NVar7.raw;
  (pEVar13->closeBrace).rawLen = uVar8;
  (pEVar13->closeBrace).info = pIVar2;
  (pEVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->dimensions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pEVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pEVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pEVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pEVar13->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (pEVar13->dimensions).super_SyntaxListBase.childCount =
       (args->dimensions).super_SyntaxListBase.childCount;
  sVar3 = (args->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pEVar13->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args->dimensions).
            super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  (pEVar13->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar3;
  (pEVar13->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005daf38;
  return pEVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }